

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CAnonFuncSymtabPrep::finish(CAnonFuncSymtabPrep *this)

{
  CTcPrsSymtab *pCVar1;
  CTcPrsSymtab *tab;
  CTcPrsSymtab *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  bool bVar2;
  undefined8 local_10;
  
  local_10 = CTcParser::get_local_symtab(G_prs);
  while( true ) {
    bVar2 = false;
    if (local_10 != (CTcPrsSymtab *)0x0) {
      in_stack_ffffffffffffffd8 = local_10;
      pCVar1 = CTcParser::get_global_symtab(G_prs);
      bVar2 = in_stack_ffffffffffffffd8 != pCVar1;
    }
    if (bVar2 == false) break;
    CTcPrsSymtab::enum_entries
              ((CTcPrsSymtab *)CONCAT17(bVar2,in_stack_ffffffffffffffe0),
               (_func_void_void_ptr_CTcSymbol_ptr *)in_stack_ffffffffffffffd8,(void *)0x27318e);
    local_10 = CTcPrsSymtab::get_parent(local_10);
  }
  return;
}

Assistant:

void finish()
    {
        /*
         *   Enumerate all of the entries in our scope once again - this
         *   time, we want to determine if there are any variables that were
         *   not previously referenced from anonymous functions but have been
         *   now; we need to convert all such variables to context locals.  
         */
        for (CTcPrsSymtab *tab = G_prs->get_local_symtab() ;
             tab != 0 && tab != G_prs->get_global_symtab() ;
             tab = tab->get_parent())
        {
            /* enumerate entries in this table */
            tab->enum_entries(&enum_for_anon2, this);
        }
    }